

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-strtod.cc
# Opt level: O1

void TestRandomStrtof(void)

{
  int iVar1;
  bool bVar2;
  uint32_t uVar3;
  int exponent;
  undefined8 uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  Vector<const_char> buffer_02;
  Vector<const_char> buffer_03;
  char buffer [1024];
  double_conversion local_438 [1032];
  
  uVar8 = 1;
  do {
    iVar5 = 0;
    do {
      uVar6 = 0;
      do {
        uVar7 = uVar6;
        uVar3 = DeterministicRandom();
        local_438[uVar7] = (double_conversion)((char)uVar3 + (char)(uVar3 / 10) * -10 | 0x30);
        uVar6 = uVar7 + 1;
      } while (uVar8 != uVar6);
      uVar3 = DeterministicRandom();
      exponent = uVar3 / 0xb + (uVar3 / 0xb) * 10;
      iVar1 = ((uVar3 - exponent) - (int)uVar8) + -5;
      local_438[uVar7 + 1] = (double_conversion)0x0;
      buffer_00.start_ = uVar6 & 0xffffffff;
      buffer_00.length_ = iVar1;
      buffer_00._12_4_ = 0;
      fVar9 = double_conversion::Strtof(local_438,buffer_00,exponent);
      buffer_02._8_8_ = uVar6 & 0xffffffff;
      buffer_02.start_ = (char *)local_438;
      bVar2 = CheckFloat(buffer_02,iVar1,fVar9);
      if (!bVar2) {
        uVar4 = 0x40b;
        goto LAB_00876f7d;
      }
      bVar2 = iVar5 == 0;
      iVar5 = iVar5 + 1;
    } while (bVar2);
    uVar8 = uVar8 + 1;
  } while (uVar8 != 0xf);
  uVar8 = 0xf;
  do {
    iVar5 = 0;
    do {
      uVar6 = 0;
      do {
        uVar7 = uVar6;
        uVar3 = DeterministicRandom();
        local_438[uVar7] = (double_conversion)((char)uVar3 + (char)(uVar3 / 10) * -10 | 0x30);
        uVar6 = uVar7 + 1;
      } while (uVar8 != uVar6);
      uVar3 = DeterministicRandom();
      iVar1 = (uVar3 % 0x4d - (int)uVar8) + -0x26;
      local_438[uVar7 + 1] = (double_conversion)0x0;
      buffer_01.start_ = uVar6 & 0xffffffff;
      buffer_01.length_ = iVar1;
      buffer_01._12_4_ = 0;
      fVar9 = double_conversion::Strtof(local_438,buffer_01,(uVar3 / 0x4d) * 0x4d);
      buffer_03._8_8_ = uVar6 & 0xffffffff;
      buffer_03.start_ = (char *)local_438;
      bVar2 = CheckFloat(buffer_03,iVar1,fVar9);
      if (!bVar2) {
        uVar4 = 0x418;
LAB_00876f7d:
        printf("%s:%d:\n CHECK(%s) failed\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-strtod.cc"
               ,uVar4,"CheckFloat(vector, exponent, strtof_result)");
        abort();
      }
      bVar2 = iVar5 == 0;
      iVar5 = iVar5 + 1;
    } while (bVar2);
    bVar2 = 0x31d < uVar8;
    uVar8 = uVar8 + 2;
    if (bVar2) {
      return;
    }
  } while( true );
}

Assistant:

TEST(RandomStrtof) {
  char buffer[kBufferSize];
  for (int length = 1; length < 15; length++) {
    for (int i = 0; i < kShortStrtofRandomCount; ++i) {
      int pos = 0;
      for (int j = 0; j < length; ++j) {
        buffer[pos++] = DeterministicRandom() % 10 + '0';
      }
      int exponent = DeterministicRandom() % (5*2 + 1) - 5 - length;
      buffer[pos] = '\0';
      Vector<const char> vector(buffer, pos);
      float strtof_result = Strtof(vector, exponent);
      CHECK(CheckFloat(vector, exponent, strtof_result));
    }
  }
  for (int length = 15; length < 800; length += 2) {
    for (int i = 0; i < kLargeStrtofRandomCount; ++i) {
      int pos = 0;
      for (int j = 0; j < length; ++j) {
        buffer[pos++] = DeterministicRandom() % 10 + '0';
      }
      int exponent = DeterministicRandom() % (38*2 + 1) - 38 - length;
      buffer[pos] = '\0';
      Vector<const char> vector(buffer, pos);
      float strtof_result = Strtof(vector, exponent);
      CHECK(CheckFloat(vector, exponent, strtof_result));
    }
  }
}